

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O2

int cuddSymmCheck(DdManager *table,int x,int y)

{
  DdHalfWord DVar1;
  DdSubtable *pDVar2;
  DdManager *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  DdNode *pDVar12;
  int iVar13;
  ulong uVar14;
  DdHalfWord DVar15;
  DdNode *pDVar16;
  DdNode **ppDVar17;
  DdNode *pDVar18;
  DdNode *pDVar19;
  DdNode *pDVar20;
  DdNode *pDVar21;
  
  pDVar2 = table->subtables;
  uVar9 = 0;
  if (pDVar2[x].keys != 1) {
    DVar1 = table->invperm[y];
    if ((pDVar2[y].keys != 1) || (table->vars[(int)DVar1]->ref != 1)) {
      uVar14 = 0;
      uVar10 = (ulong)pDVar2[x].slots;
      if ((int)pDVar2[x].slots < 1) {
        uVar10 = uVar14;
      }
      bVar7 = true;
      bVar8 = true;
      iVar11 = 0;
      for (; uVar14 != uVar10; uVar14 = uVar14 + 1) {
        ppDVar17 = pDVar2[x].nodelist + uVar14;
        while (pDVar3 = (DdManager *)*ppDVar17, pDVar3 != table) {
          pDVar4 = (pDVar3->sentinel).type.kids.T;
          pDVar5 = (pDVar3->sentinel).type.kids.E;
          pDVar18 = (DdNode *)((ulong)pDVar5 & 0xfffffffffffffffe);
          if (pDVar4->index == DVar1) {
            iVar11 = iVar11 + 1;
            DVar15 = pDVar18->index;
            pDVar12 = (pDVar4->type).kids.T;
            pDVar19 = (pDVar4->type).kids.E;
LAB_0074fd91:
            pDVar20 = pDVar18;
            pDVar21 = pDVar18;
            if (DVar15 == DVar1) goto LAB_0074fd9c;
          }
          else {
            DVar15 = pDVar18->index;
            pDVar12 = pDVar4;
            pDVar19 = pDVar4;
            if (DVar15 != DVar1) {
              if (pDVar4 != table->one) {
                return 0;
              }
              if (table->one != pDVar18) {
                return 0;
              }
              if ((pDVar3->sentinel).ref != 1) {
                return 0;
              }
              goto LAB_0074fd91;
            }
LAB_0074fd9c:
            iVar11 = iVar11 + 1;
            pDVar21 = (pDVar18->type).kids.T;
            pDVar20 = (pDVar18->type).kids.E;
          }
          pDVar16 = (DdNode *)((ulong)pDVar21 ^ 1);
          pDVar6 = (DdNode *)((ulong)pDVar20 ^ 1);
          if (((ulong)pDVar5 & 1) == 0) {
            pDVar16 = pDVar21;
            pDVar6 = pDVar20;
          }
          if (((pDVar4 != table->one) || (table->one != pDVar18)) || ((pDVar3->sentinel).ref != 1))
          {
            bVar7 = (bool)(bVar7 & pDVar16 == pDVar19);
            bVar8 = (bool)(bVar8 & pDVar12 == pDVar6);
            if (!bVar7 && !bVar8) {
              return 0;
            }
          }
          ppDVar17 = &(pDVar3->sentinel).next;
        }
      }
      uVar14 = 0;
      uVar10 = (ulong)pDVar2[y].slots;
      if ((int)pDVar2[y].slots < 1) {
        uVar10 = uVar14;
      }
      iVar13 = -1;
      for (; uVar14 != uVar10; uVar14 = uVar14 + 1) {
        ppDVar17 = pDVar2[y].nodelist + uVar14;
        while (pDVar3 = (DdManager *)*ppDVar17, pDVar3 != table) {
          iVar13 = iVar13 + (pDVar3->sentinel).ref;
          ppDVar17 = &(pDVar3->sentinel).next;
        }
      }
      uVar9 = (uint)(iVar11 == iVar13);
    }
  }
  return uVar9;
}

Assistant:

int
cuddSymmCheck(
  DdManager * table,
  int  x,
  int  y)
{
    DdNode *f,*f0,*f1,*f01,*f00,*f11,*f10;
    int comple;         /* f0 is complemented */
    int xsymmy;         /* x and y may be positively symmetric */
    int xsymmyp;        /* x and y may be negatively symmetric */
    int arccount;       /* number of arcs from layer x to layer y */
    int TotalRefCount;  /* total reference count of layer y minus 1 */
    int yindex;
    int i;
    DdNodePtr *list;
    int slots;
    DdNode *sentinel = &(table->sentinel);
#ifdef DD_DEBUG
    int xindex;
#endif

    /* Checks that x and y are not the projection functions.
    ** For x it is sufficient to check whether there is only one
    ** node; indeed, if there is one node, it is the projection function
    ** and it cannot point to y. Hence, if y isn't just the projection
    ** function, it has one arc coming from a layer different from x.
    */
    if (table->subtables[x].keys == 1) {
        return(0);
    }
    yindex = table->invperm[y];
    if (table->subtables[y].keys == 1) {
        if (table->vars[yindex]->ref == 1)
            return(0);
    }

    xsymmy = xsymmyp = 1;
    arccount = 0;
    slots = table->subtables[x].slots;
    list = table->subtables[x].nodelist;
    for (i = 0; i < slots; i++) {
        f = list[i];
        while (f != sentinel) {
            /* Find f1, f0, f11, f10, f01, f00. */
            f1 = cuddT(f);
            f0 = Cudd_Regular(cuddE(f));
            comple = Cudd_IsComplement(cuddE(f));
            if ((int) f1->index == yindex) {
                arccount++;
                f11 = cuddT(f1); f10 = cuddE(f1);
            } else {
                if ((int) f0->index != yindex) {
                    /* If f is an isolated projection function it is
                    ** allowed to bypass layer y.
                    */
                    if (f1 != DD_ONE(table) || f0 != DD_ONE(table) || f->ref != 1)
                        return(0); /* f bypasses layer y */
                }
                f11 = f10 = f1;
            }
            if ((int) f0->index == yindex) {
                arccount++;
                f01 = cuddT(f0); f00 = cuddE(f0);
            } else {
                f01 = f00 = f0;
            }
            if (comple) {
                f01 = Cudd_Not(f01);
                f00 = Cudd_Not(f00);
            }

            if (f1 != DD_ONE(table) || f0 != DD_ONE(table) || f->ref != 1) {
                xsymmy &= f01 == f10;
                xsymmyp &= f11 == f00;
                if ((xsymmy == 0) && (xsymmyp == 0))
                    return(0);
            }

            f = f->next;
        } /* while */
    } /* for */

    /* Calculate the total reference counts of y */
    TotalRefCount = -1; /* -1 for projection function */
    slots = table->subtables[y].slots;
    list = table->subtables[y].nodelist;
    for (i = 0; i < slots; i++) {
        f = list[i];
        while (f != sentinel) {
            TotalRefCount += f->ref;
            f = f->next;
        }
    }

#if defined(DD_DEBUG) && defined(DD_VERBOSE)
    if (arccount == TotalRefCount) {
        xindex = table->invperm[x];
        (void) fprintf(table->out,
                       "Found symmetry! x =%d\ty = %d\tPos(%d,%d)\n",
                       xindex,yindex,x,y);
    }
#endif

    return(arccount == TotalRefCount);

}